

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O0

void __thiscall
Omega_h::Write<signed_char>::Write(Write<signed_char> *this,LO size_in,string *name_in)

{
  Alloc *pAVar1;
  SharedAlloc local_a0 [2];
  string *local_80;
  string *name_in_local;
  Write<signed_char> *pWStack_70;
  LO size_in_local;
  Write<signed_char> *this_local;
  SharedAlloc *local_60;
  Write<signed_char> *local_58;
  SharedAlloc *local_50;
  SharedAlloc *local_28;
  Write<signed_char> *local_20;
  SharedAlloc *local_18;
  Write<signed_char> *local_10;
  
  (this->shared_alloc_).alloc = (Alloc *)0x0;
  (this->shared_alloc_).direct_ptr = (void *)0x0;
  local_80 = name_in;
  name_in_local._4_4_ = size_in;
  pWStack_70 = this;
  this_local = this;
  begin_code("Write allocation",(char *)0x0);
  SharedAlloc::SharedAlloc(local_a0,(long)name_in_local._4_4_,local_80);
  local_60 = local_a0;
  local_58 = this;
  local_20 = this;
  if (((((this->shared_alloc_).alloc != (Alloc *)0x0) &&
       (((ulong)(this->shared_alloc_).alloc & 7) == 0)) &&
      (pAVar1 = (this->shared_alloc_).alloc, pAVar1->use_count = pAVar1->use_count + -1,
      ((this->shared_alloc_).alloc)->use_count == 0)) &&
     (pAVar1 = (this->shared_alloc_).alloc, pAVar1 != (Alloc *)0x0)) {
    Alloc::~Alloc(pAVar1);
    operator_delete(pAVar1,0x48);
  }
  local_18 = local_60;
  (this->shared_alloc_).alloc = local_60->alloc;
  (this->shared_alloc_).direct_ptr = local_60->direct_ptr;
  if ((((this->shared_alloc_).alloc != (Alloc *)0x0) &&
      (((ulong)(this->shared_alloc_).alloc & 7) == 0)) && ((entering_parallel & 1) != 0)) {
    pAVar1 = (this->shared_alloc_).alloc;
    pAVar1->use_count = pAVar1->use_count + -1;
    (this->shared_alloc_).alloc = (Alloc *)(((this->shared_alloc_).alloc)->size << 3 | 1);
  }
  local_10 = this;
  local_60->alloc = (Alloc *)0x0;
  local_18->direct_ptr = (void *)0x0;
  local_50 = local_a0;
  local_28 = local_50;
  if (((local_a0[0].alloc != (Alloc *)0x0) && (((ulong)local_a0[0].alloc & 7) == 0)) &&
     (((local_a0[0].alloc)->use_count = (local_a0[0].alloc)->use_count + -1,
      (local_a0[0].alloc)->use_count == 0 && (local_a0[0].alloc != (Alloc *)0x0)))) {
    Alloc::~Alloc(local_a0[0].alloc);
    operator_delete(local_a0[0].alloc,0x48);
  }
  end_code();
  return;
}

Assistant:

Write<T>::Write(LO size_in, std::string const& name_in) {
  begin_code("Write allocation");
#ifdef OMEGA_H_USE_KOKKOS
  view_ = decltype(view_)(Kokkos::ViewAllocateWithoutInitializing(name_in),
      static_cast<std::size_t>(size_in));
#else
  shared_alloc_ = decltype(shared_alloc_)(
      sizeof(T) * static_cast<std::size_t>(size_in), name_in);
#endif
  end_code();
}